

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oauth2.c
# Opt level: O2

CURLcode Curl_auth_create_oauth_bearer_message
                   (char *user,char *host,long port,char *bearer,bufref *out)

{
  CURLcode CVar1;
  char *__s;
  size_t len;
  
  if ((port == 0x50) || (port == 0)) {
    __s = curl_maprintf("n,a=%s,\x01host=%s\x01auth=Bearer %s\x01\x01",user,host,bearer);
  }
  else {
    __s = curl_maprintf("n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01",user,host);
  }
  if (__s == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    len = strlen(__s);
    Curl_bufref_set(out,__s,len,curl_free);
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_auth_create_oauth_bearer_message(const char *user,
                                               const char *host,
                                               const long port,
                                               const char *bearer,
                                               struct bufref *out)
{
  char *oauth;

  /* Generate the message */
  if(port == 0 || port == 80)
    oauth = aprintf("n,a=%s,\1host=%s\1auth=Bearer %s\1\1", user, host,
                    bearer);
  else
    oauth = aprintf("n,a=%s,\1host=%s\1port=%ld\1auth=Bearer %s\1\1", user,
                    host, port, bearer);
  if(!oauth)
    return CURLE_OUT_OF_MEMORY;

  Curl_bufref_set(out, oauth, strlen(oauth), curl_free);
  return CURLE_OK;
}